

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataVariable.h
# Opt level: O1

void __thiscall Rml::FuncDefinition::~FuncDefinition(FuncDefinition *this)

{
  _Manager_type p_Var1;
  
  p_Var1 = (this->set).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->set,(_Any_data *)&this->set,__destroy_functor);
  }
  p_Var1 = (this->get).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->get,(_Any_data *)&this->get,__destroy_functor);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

class RMLUICORE_API FuncDefinition final : public VariableDefinition {
public:
	FuncDefinition(DataGetFunc get, DataSetFunc set);

	bool Get(void* ptr, Variant& variant) override;
	bool Set(void* ptr, const Variant& variant) override;

private:
	DataGetFunc get;
	DataSetFunc set;
}